

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O1

void __thiscall
de::
SharedPtrState<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>,_de::DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>_>_>
::deletePtr(SharedPtrState<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>,_de::DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>_>_>
            *this)

{
  Unique<vk::Handle<(vk::HandleType)12>_> *pUVar1;
  VkBufferView obj;
  
  pUVar1 = this->m_ptr;
  if (pUVar1 != (Unique<vk::Handle<(vk::HandleType)12>_> *)0x0) {
    obj.m_internal =
         (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)12>_>).m_data.object.m_internal;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                (&(pUVar1->super_RefBase<vk::Handle<(vk::HandleType)12>_>).m_data.deleter,obj);
    }
    (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)12>_>).m_data.deleter.m_device = (VkDevice)0x0
    ;
    (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)12>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)12>_>).m_data.object.m_internal = 0;
    (pUVar1->super_RefBase<vk::Handle<(vk::HandleType)12>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    operator_delete(pUVar1,0x20);
  }
  this->m_ptr = (Unique<vk::Handle<(vk::HandleType)12>_> *)0x0;
  return;
}

Assistant:

virtual void deletePtr (void) throw()
	{
		m_deleter(m_ptr);
		m_ptr = DE_NULL;
	}